

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_extension.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_62a6c::PyListCtrlPMatchSource<cpsm::UntilLastTabMatch>::fill
          (PyListCtrlPMatchSource<cpsm::UntilLastTabMatch> *this,
          vector<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>_>_>
          *items)

{
  pointer *ppPVar1;
  pointer pPVar2;
  pointer pPVar3;
  pointer pPVar4;
  size_t sVar5;
  Obj p_Var6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pPVar10;
  pointer pPVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  size_t local_38;
  
  std::mutex::lock(&this->mu_);
  if (this->done_ == false) {
    lVar13 = this->i_;
    lVar12 = lVar13 + 0x200;
    if (this->size_ < lVar13 + 0x200) {
      lVar12 = this->size_;
    }
    while (lVar13 < lVar12) {
      p_Var6 = (Obj)PyList_GetItem(this->list_);
      if ((p_Var6 == (Obj)0x0) ||
         (pcVar7 = (char *)PyUnicode_AsUTF8AndSize(p_Var6,&local_38), sVar5 = local_38,
         pcVar7 == (char *)0x0)) {
        this->done_ = true;
        goto LAB_001297e0;
      }
      pPVar2 = (items->
               super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar2 == (items->
                    super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pPVar3 = (items->
                 super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((long)pPVar2 - (long)pPVar3 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar8 = ((long)pPVar2 - (long)pPVar3) / 0x18;
        uVar9 = uVar8;
        if (pPVar2 == pPVar3) {
          uVar9 = 1;
        }
        uVar14 = uVar9 + uVar8;
        if (0x555555555555554 < uVar14) {
          uVar14 = 0x555555555555555;
        }
        if (CARRY8(uVar9,uVar8)) {
          uVar14 = 0x555555555555555;
        }
        if (uVar14 == 0) {
          pPVar10 = (pointer)0x0;
        }
        else {
          pPVar10 = (pointer)operator_new(uVar14 * 0x18);
        }
        pPVar10[uVar8].inner.inner.item_.ptr_ = pcVar7;
        pPVar10[uVar8].inner.inner.item_.len_ = sVar5;
        pPVar10[uVar8].obj = p_Var6;
        pPVar4 = pPVar10;
        for (pPVar11 = pPVar3; pPVar11 != pPVar2; pPVar11 = pPVar11 + 1) {
          pPVar4->obj = pPVar11->obj;
          sVar5 = (pPVar11->inner).inner.item_.len_;
          (pPVar4->inner).inner.item_.ptr_ = (pPVar11->inner).inner.item_.ptr_;
          (pPVar4->inner).inner.item_.len_ = sVar5;
          pPVar4 = pPVar4 + 1;
        }
        if (pPVar3 != (pointer)0x0) {
          operator_delete(pPVar3);
        }
        (items->
        super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>_>_>
        )._M_impl.super__Vector_impl_data._M_start = pPVar10;
        (items->
        super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pPVar4 + 1;
        (items->
        super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar10 + uVar14;
      }
      else {
        (pPVar2->inner).inner.item_.ptr_ = pcVar7;
        (pPVar2->inner).inner.item_.len_ = local_38;
        pPVar2->obj = p_Var6;
        ppPVar1 = &(items->
                   super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::UntilLastTabMatch>,_false>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppPVar1 = *ppPVar1 + 1;
      }
      lVar13 = this->i_ + 1;
      this->i_ = lVar13;
    }
    bVar15 = lVar13 != this->size_;
  }
  else {
LAB_001297e0:
    bVar15 = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar15;
}

Assistant:

bool fill(std::vector<Item>& items) {
    std::lock_guard<std::mutex> lock(mu_);
    if (done_) {
      return false;
    }
    auto const add_item = [&](PyObject* item_obj) {
      if (item_obj == nullptr) {
        return false;
      }
      char* item_data;
      Py_ssize_t item_size;
      if (!PyVimString_AsStringAndSize(item_obj, &item_data, &item_size)) {
        return false;
      }
      items.emplace_back(
          cpsm::CtrlPItem<cpsm::StringRefItem, MatchMode>(
              (cpsm::StringRefItem(boost::string_ref(item_data, item_size)))),
          item_obj);
      return true;
    };
    Py_ssize_t const max = std::min(i_ + batch_size(), size_);
    for (; i_ < max; i_++) {
      if (!add_item(PyList_GetItem(list_, i_))) {
        done_ = true;
        return false;
      }
    }
    return i_ != size_;
  }